

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O1

int check_lookbehinds(compile_block_16 *cb)

{
  BOOL BVar1;
  uint32_t *puVar2;
  uint32_t uVar3;
  int errorcode;
  int loopcount;
  uint32_t *local_38;
  int local_30 [2];
  
  local_30[0] = 0;
  local_30[1] = 0;
  cb->erroroffset = 0xffffffffffffffff;
  puVar2 = cb->parsed_pattern;
  uVar3 = *puVar2;
  do {
    local_38 = puVar2;
    if ((int)uVar3 < 0) {
      switch(uVar3 + 0x7fff0000 >> 0x10) {
      case 0:
      case 1:
      case 2:
      case 7:
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0xe:
      case 0x15:
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1d:
      case 0x1e:
      case 0x21:
      case 0x22:
      case 0x26:
      case 0x27:
      case 0x28:
      case 0x2a:
      case 0x2c:
      case 0x2e:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
        break;
      case 3:
      case 5:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x20:
        local_38 = puVar2 + 3;
        break;
      case 4:
      case 0x1a:
      case 0x1b:
      case 0x1c:
switchD_001408bc_caseD_4:
        local_38 = puVar2 + 1;
        break;
      case 6:
        local_38 = puVar2 + 5;
        break;
      case 0x17:
        if (uVar3 + 0x7fe7fff1 < 2) goto switchD_001408bc_caseD_4;
        break;
      case 0x1f:
      case 0x39:
      case 0x3a:
      case 0x3b:
        local_38 = puVar2 + 2;
        break;
      case 0x23:
      case 0x24:
        BVar1 = set_lookbehind_lengths
                          (&local_38,local_30,local_30 + 1,(parsed_recurse_check *)0x0,cb);
        if (BVar1 == 0) {
          return local_30[0];
        }
        break;
      case 0x25:
      case 0x29:
      case 0x2b:
      case 0x2d:
      case 0x2f:
        local_38 = puVar2 + (puVar2[1] + 1);
        break;
      default:
        return 0xaa;
      }
    }
    puVar2 = local_38 + 1;
    uVar3 = local_38[1];
  } while( true );
}

Assistant:

static int
check_lookbehinds(compile_block *cb)
{
uint32_t *pptr;
int errorcode = 0;
int loopcount = 0;

cb->erroroffset = PCRE2_UNSET;

for (pptr = cb->parsed_pattern; *pptr != META_END; pptr++)
  {
  if (*pptr < META_END) continue;  /* Literal */

  switch (META_CODE(*pptr))
    {
    default:
    return ERR70;  /* Unrecognized meta code */

    case META_ESCAPE:
    if (*pptr - META_ESCAPE == ESC_P || *pptr - META_ESCAPE == ESC_p)
      pptr += 1;
    break;

    case META_ACCEPT:
    case META_ALT:
    case META_ASTERISK:
    case META_ASTERISK_PLUS:
    case META_ASTERISK_QUERY:
    case META_ATOMIC:
    case META_BACKREF:
    case META_CAPTURE:
    case META_CIRCUMFLEX:
    case META_CLASS:
    case META_CLASS_EMPTY:
    case META_CLASS_EMPTY_NOT:
    case META_CLASS_END:
    case META_CLASS_NOT:
    case META_COMMIT:
    case META_COND_ASSERT:
    case META_DOLLAR:
    case META_DOT:
    case META_FAIL:
    case META_KET:
    case META_LOOKAHEAD:
    case META_LOOKAHEADNOT:
    case META_NOCAPTURE:
    case META_PLUS:
    case META_PLUS_PLUS:
    case META_PLUS_QUERY:
    case META_PRUNE:
    case META_QUERY:
    case META_QUERY_PLUS:
    case META_QUERY_QUERY:
    case META_RANGE_ESCAPED:
    case META_RANGE_LITERAL:
    case META_SKIP:
    case META_THEN:
    break;

    case META_RECURSE:
    pptr += SIZEOFFSET;
    break;

    case META_BACKREF_BYNAME:
    case META_COND_DEFINE:
    case META_COND_NAME:
    case META_COND_NUMBER:
    case META_COND_RNAME:
    case META_COND_RNUMBER:
    case META_RECURSE_BYNAME:
    pptr += 1 + SIZEOFFSET;
    break;

    case META_CALLOUT_STRING:
    pptr += 3 + SIZEOFFSET;
    break;

    case META_BIGVALUE:
    case META_OPTIONS:
    case META_POSIX:
    case META_POSIX_NEG:
    pptr += 1;
    break;

    case META_MINMAX:
    case META_MINMAX_QUERY:
    case META_MINMAX_PLUS:
    pptr += 2;
    break;

    case META_CALLOUT_NUMBER:
    case META_COND_VERSION:
    pptr += 3;
    break;

    case META_MARK:
    case META_COMMIT_ARG:
    case META_PRUNE_ARG:
    case META_SKIP_ARG:
    case META_THEN_ARG:
    pptr += 1 + pptr[1];
    break;

    case META_LOOKBEHIND:
    case META_LOOKBEHINDNOT:
    if (!set_lookbehind_lengths(&pptr, &errorcode, &loopcount, NULL, cb))
      return errorcode;
    break;
    }
  }

return 0;
}